

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.cc
# Opt level: O2

void __thiscall
prometheus::detail::Endpoint::Endpoint(Endpoint *this,CivetServer *server,string *uri)

{
  weak_ptr<prometheus::Collectable> wStack_38;
  
  this->server_ = server;
  std::__cxx11::string::string((string *)&this->uri_,(string *)uri);
  std::make_shared<prometheus::Registry>();
  make_unique<prometheus::detail::MetricsHandler,prometheus::Registry&>
            ((detail *)&this->metrics_handler_,
             (this->endpoint_registry_).
             super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  (this->auth_handler_)._M_t.
  super___uniq_ptr_impl<prometheus::BasicAuthHandler,_std::default_delete<prometheus::BasicAuthHandler>_>
  ._M_t.
  super__Tuple_impl<0UL,_prometheus::BasicAuthHandler_*,_std::default_delete<prometheus::BasicAuthHandler>_>
  .super__Head_base<0UL,_prometheus::BasicAuthHandler_*,_false>._M_head_impl =
       (BasicAuthHandler *)0x0;
  std::__weak_ptr<prometheus::Collectable,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<prometheus::Registry,void>
            ((__weak_ptr<prometheus::Collectable,(__gnu_cxx::_Lock_policy)2> *)&wStack_38,
             &(this->endpoint_registry_).
              super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>);
  RegisterCollectable(this,&wStack_38);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&wStack_38.super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CivetServer::addHandler
            (this->server_,&this->uri_,
             &((this->metrics_handler_)._M_t.
               super___uniq_ptr_impl<prometheus::detail::MetricsHandler,_std::default_delete<prometheus::detail::MetricsHandler>_>
               ._M_t.
               super__Tuple_impl<0UL,_prometheus::detail::MetricsHandler_*,_std::default_delete<prometheus::detail::MetricsHandler>_>
               .super__Head_base<0UL,_prometheus::detail::MetricsHandler_*,_false>._M_head_impl)->
              super_CivetHandler);
  return;
}

Assistant:

Endpoint::Endpoint(CivetServer& server, std::string uri)
    : server_(server),
      uri_(std::move(uri)),
      endpoint_registry_(std::make_shared<Registry>()),
      metrics_handler_(
          detail::make_unique<MetricsHandler>(*endpoint_registry_)) {
  RegisterCollectable(endpoint_registry_);
  server_.addHandler(uri_, metrics_handler_.get());
}